

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O3

void __thiscall
wabt::AST::Set<(wabt::ExprType)26>(AST *this,VarExpr<(wabt::ExprType)26> *ve,bool local)

{
  size_t sVar1;
  pointer pcVar2;
  Node *pNVar3;
  undefined7 in_register_00000011;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>,_bool>
  pVar4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>
  local_60;
  
  if ((int)CONCAT71(in_register_00000011,local) != 0) {
    if ((ve->var).type_ != Name) {
      __assert_fail("is_name()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/ir.h"
                    ,0x3e,"const std::string &wabt::Var::name() const");
    }
    sVar1 = this->cur_block_id;
    local_60.first._M_dataplus._M_p = (pointer)&local_60.first.field_2;
    pcVar2 = (ve->var).field_2.name_._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar2,pcVar2 + (ve->var).field_2.name_._M_string_length);
    local_60.second.defined = false;
    local_60.second.block_id = sVar1;
    pVar4 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::AST::Variable>,std::_Select1st<std::pair<std::__cxx11::string_const,wabt::AST::Variable>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::AST::Variable>>>
            ::_M_insert_unique<std::pair<std::__cxx11::string_const,wabt::AST::Variable>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::AST::Variable>,std::_Select1st<std::pair<std::__cxx11::string_const,wabt::AST::Variable>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::AST::Variable>>>
                        *)&this->vars_defined,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
      operator_delete(local_60.first._M_dataplus._M_p,
                      local_60.first.field_2._M_allocated_capacity + 1);
    }
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (this->value_stack_depth == 1) {
        pNVar3 = InsertNode(this,DeclInit,Nop,(Expr *)0x0,1);
        (pNVar3->u).var = &ve->var;
        return;
      }
      PreDecl<(wabt::ExprType)26>(this,ve);
    }
  }
  InsertNode(this,Expr,LocalTee,(Expr *)ve,1);
  return;
}

Assistant:

void Set(const VarExpr<T>& ve, bool local) {
    // Seen this var before?
    if (local &&
        vars_defined.insert({ve.var.name(), {cur_block_id, false}}).second) {
      if (value_stack_depth == 1) {
        // Top level, declare it here.
        InsertNode(NodeType::DeclInit, ExprType::Nop, nullptr, 1).u.var =
            &ve.var;
        return;
      } else {
        // Inside exp, better leave it as assignment exp and lift the decl out.
        PreDecl(ve);
      }
    }
    InsertNode(NodeType::Expr, T, &ve, 1);
  }